

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_SimpleClosedQuad_Test::testBody
          (TEST_MinipointCounterTest_SimpleClosedQuad_Test *this)

{
  int iVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffff58;
  int value;
  NormalTestTerminator local_48;
  NormalTestTerminator local_40;
  SimpleString local_38 [3];
  SimpleString local_20;
  undefined3 local_18;
  undefined2 local_13;
  undefined1 local_11;
  TEST_MinipointCounterTest_SimpleClosedQuad_Test *local_10;
  TEST_MinipointCounterTest_SimpleClosedQuad_Test *this_local;
  
  value = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_10 = this;
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,EightOfCircles,false);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addOpenNoPointsHandWithoutOneMeld
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest);
  local_13 = 0;
  local_11 = 0;
  local_18 = 0;
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).s,
             (WinByDiscardSituation)0x0);
  iVar1 = mahjong::MinipointCounter::total
                    (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
  if (iVar1 == 0x24) {
    pUVar3 = UtestShell::getCurrent();
    local_48.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_48);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,0x111,&local_48);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1beecd);
  }
  else {
    iVar1 = mahjong::MinipointCounter::total
                      (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    iVar2 = mahjong::MinipointCounter::total
                      (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    if (iVar1 != iVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                 ,0x111);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_20);
    mahjong::MinipointCounter::total
              (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(local_38);
    local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_40);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,CONCAT44(value,0x111),&local_40);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1bee0d);
    SimpleString::~SimpleString((SimpleString *)0x1bee16);
    SimpleString::~SimpleString((SimpleString *)0x1bee1f);
  }
  return;
}

Assistant:

TEST(MinipointCounterTest, SimpleClosedQuad)
{
	addQuad(Tile::EightOfCircles, false);
	addOpenNoPointsHandWithoutOneMeld();
	s.winByDiscard();

	CHECK_EQUAL(36, m.total(false));
}